

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

int __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::EncodeHole
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex start_corner_id,bool encode_first_vertex)

{
  bool bVar1;
  uint uVar2;
  vector<int,_std::allocator<int>_> *this_00;
  pointer this_01;
  CornerTable *this_02;
  size_type __n;
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  VertexIndex act_vertex_id;
  VertexIndex start_vert_id;
  int num_encoded_hole_verts;
  VertexIndex start_vertex_id;
  CornerIndex corner_id;
  CornerTable *in_stack_fffffffffffffef8;
  pointer in_stack_ffffffffffffff00;
  CornerTable *in_stack_ffffffffffffff08;
  CornerIndex corner;
  undefined8 in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff20;
  ThisIndexType local_b4;
  uint local_b0;
  ThisIndexType local_ac;
  uint local_a8;
  ThisIndexType local_a4;
  uint local_a0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_9c;
  uint local_98;
  ThisIndexType local_94;
  reference local_90;
  uint local_80;
  uint local_7c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_78;
  uint local_74;
  uint local_70;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_6c;
  reference local_68;
  reference local_58;
  int local_44;
  uint local_40;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_3c;
  uint local_38;
  ThisIndexType local_34;
  uint local_30;
  ThisIndexType local_2c;
  uint local_28;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_24;
  uint local_20;
  ThisIndexType local_1c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_18;
  byte local_11;
  uint local_4;
  
  local_11 = in_DL & 1;
  local_18.value_ = in_ESI;
  local_4 = in_ESI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x197605);
  local_20 = local_18.value_;
  local_1c.value_ =
       (uint)CornerTable::Previous(in_stack_ffffffffffffff08,(uint)in_stack_ffffffffffffff10);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_18,&local_1c);
  while( true ) {
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19764c)
    ;
    local_28 = local_18.value_;
    local_24.value_ =
         (uint)CornerTable::Opposite(in_stack_fffffffffffffef8,(uint)in_stack_ffffffffffffff00);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                      (&local_24,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    corner.value_ = (uint)in_stack_ffffffffffffff10;
    if (!bVar1) break;
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19769b)
    ;
    local_30 = local_18.value_;
    local_2c.value_ =
         (uint)CornerTable::Opposite(in_stack_fffffffffffffef8,(uint)in_stack_ffffffffffffff00);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_18,&local_2c);
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1976e2)
    ;
    local_38 = local_18.value_;
    local_34.value_ =
         (uint)CornerTable::Next(in_stack_ffffffffffffff08,(uint)in_stack_ffffffffffffff10);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_18,&local_34);
  }
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19772e);
  local_40 = local_4;
  local_3c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,corner);
  local_44 = 0;
  if ((local_11 & 1) != 0) {
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_3c);
    local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::_Bit_reference::operator=(&local_58,true);
    local_44 = local_44 + 1;
  }
  __n = in_RDI + 0x148;
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x170);
  uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_3c);
  std::vector<int,_std::allocator<int>_>::operator[](this_00,(ulong)uVar2);
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[](in_stack_ffffffffffffff20,__n);
  std::_Bit_reference::operator=(&local_68,true);
  this_01 = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                       0x19783c);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19784f);
  local_74 = local_18.value_;
  local_70 = (uint)CornerTable::Next(in_stack_ffffffffffffff08,(CornerIndex)(uint)this_00);
  local_6c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,(uint)this_00);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x197899);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1978ac);
  local_80 = local_18.value_;
  local_7c = (uint)CornerTable::Previous(in_stack_ffffffffffffff08,(CornerIndex)(uint)this_00);
  local_78.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,(uint)this_00);
  while( true ) {
    bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator!=(&local_78,&local_3c);
    if (!bVar1) break;
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(&local_6c,&local_78);
    this_02 = (CornerTable *)(in_RDI + 0xb8);
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_78);
    local_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)this_01,__n);
    std::_Bit_reference::operator=(&local_90,true);
    local_44 = local_44 + 1;
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x197981)
    ;
    local_98 = local_18.value_;
    local_94.value_ = (uint)CornerTable::Next(this_02,(uint)this_00);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_18,&local_94);
    while( true ) {
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x1979bc);
      local_a0 = local_18.value_;
      local_9c.value_ =
           (uint)CornerTable::Opposite(in_stack_fffffffffffffef8,(uint)in_stack_ffffffffffffff00);
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                        (&local_9c,
                         (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                         &kInvalidCornerIndex);
      if (!bVar1) break;
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x1979fc);
      local_a8 = local_18.value_;
      local_a4.value_ =
           (uint)CornerTable::Opposite(in_stack_fffffffffffffef8,(uint)in_stack_ffffffffffffff00);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_18,&local_a4);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x197a37);
      local_b0 = local_18.value_;
      local_ac.value_ = (uint)CornerTable::Next(this_02,(uint)this_00);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_18,&local_ac);
    }
    in_stack_ffffffffffffff00 =
         std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                   ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                    0x197a77);
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x197a8a)
    ;
    CornerTable::Previous(this_02,(CornerIndex)(uint)this_00);
    local_b4.value_ = (uint)CornerTable::Vertex(this_02,(uint)this_00);
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(&local_78,&local_b4);
  }
  return local_44;
}

Assistant:

int MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeHole(
    CornerIndex start_corner_id, bool encode_first_vertex) {
  // We know that the start corner lies on a hole but we first need to find the
  // boundary edge going from that vertex. It is the first edge in CW
  // direction.
  CornerIndex corner_id = start_corner_id;
  corner_id = corner_table_->Previous(corner_id);
  while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
    corner_id = corner_table_->Opposite(corner_id);
    corner_id = corner_table_->Next(corner_id);
  }
  const VertexIndex start_vertex_id = corner_table_->Vertex(start_corner_id);

  int num_encoded_hole_verts = 0;
  if (encode_first_vertex) {
    visited_vertex_ids_[start_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
  }

  // corner_id is now opposite to the boundary edge.
  // Mark the hole as visited.
  visited_holes_[vertex_hole_id_[start_vertex_id.value()]] = true;
  // Get the start vertex of the edge and use it as a reference.
  VertexIndex start_vert_id =
      corner_table_->Vertex(corner_table_->Next(corner_id));
  // Get the end vertex of the edge.
  VertexIndex act_vertex_id =
      corner_table_->Vertex(corner_table_->Previous(corner_id));
  while (act_vertex_id != start_vertex_id) {
    // Encode the end vertex of the boundary edge.

    start_vert_id = act_vertex_id;

    // Mark the vertex as visited.
    visited_vertex_ids_[act_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
    corner_id = corner_table_->Next(corner_id);
    // Look for the next attached open boundary edge.
    while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
      corner_id = corner_table_->Opposite(corner_id);
      corner_id = corner_table_->Next(corner_id);
    }
    act_vertex_id = corner_table_->Vertex(corner_table_->Previous(corner_id));
  }
  return num_encoded_hole_verts;
}